

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_enc.c
# Opt level: O3

int CompressAlphaJob(void *arg1,void *unused)

{
  uint method;
  uint uVar1;
  uint dst_stride;
  uint height;
  undefined4 uVar2;
  WebPPicture *pic;
  WebPAuxStats *pWVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [14];
  undefined1 auVar6 [12];
  unkbyte10 Var7;
  int iVar8;
  int iVar9;
  WEBP_FILTER_TYPE WVar10;
  uint8_t *dst;
  ulong uVar11;
  long lVar12;
  uint8_t *puVar13;
  ulong uVar14;
  char cVar15;
  int iVar16;
  WebPEncodingError error;
  uint uVar17;
  int iVar18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar29 [16];
  undefined1 auVar32 [16];
  uint64_t local_238;
  FilterTrial best;
  uint8_t color [256];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar30 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar31 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined2 uVar33;
  
  lVar12 = *arg1;
  pic = *(WebPPicture **)((long)arg1 + 8);
  iVar8 = *(int *)(lVar12 + 8);
  method = *(uint *)(lVar12 + 0x30);
  uVar1 = *(uint *)(lVar12 + 0x38);
  dst_stride = pic->width;
  height = pic->height;
  local_238 = 0;
  if ((uVar1 < 0x65) && (method < 2)) {
    cVar15 = (*(int *)(lVar12 + 0x34) == 1) + '\x05';
    if (*(int *)(lVar12 + 0x34) == 0) {
      cVar15 = '\0';
    }
    if (method == 0) {
      cVar15 = '\0';
    }
    dst = (uint8_t *)WebPSafeMalloc(1,(long)(int)(height * dst_stride));
    if (dst != (uint8_t *)0x0) {
      WebPCopyPlane(pic->a,pic->a_stride,dst,dst_stride,dst_stride,height);
      if ((int)uVar1 < 100) {
        if (uVar1 < 0x47) {
          uVar17 = (uint)(byte)((char)((uVar1 & 0xff) / 5) + 2);
        }
        else {
          uVar17 = uVar1 * 8 - 0x220;
        }
        iVar9 = QuantizeLevels(dst,dst_stride,height,uVar17,&local_238);
        if (iVar9 != 0) goto LAB_00131120;
        puVar13 = (uint8_t *)0x0;
        uVar11 = 0;
        iVar8 = 0;
      }
      else {
LAB_00131120:
        VP8FiltersInit();
        pWVar3 = pic->stats;
        if (cVar15 == '\x06') {
          memset(color,0,0x100);
          if (0 < (int)height) {
            uVar11 = 0;
            puVar13 = dst;
            do {
              if (0 < (int)dst_stride) {
                uVar14 = 0;
                do {
                  color[puVar13[uVar14]] = '\x01';
                  uVar14 = uVar14 + 1;
                } while (dst_stride != uVar14);
              }
              uVar11 = uVar11 + 1;
              puVar13 = puVar13 + (int)dst_stride;
            } while (uVar11 != height);
          }
          lVar12 = 0;
          iVar9 = 0;
          iVar16 = 0;
          iVar18 = 0;
          iVar19 = 0;
          do {
            uVar2 = *(undefined4 *)(color + lVar12);
            auVar20[0] = -((char)uVar2 == '\0');
            auVar20[1] = -((char)((uint)uVar2 >> 8) == '\0');
            auVar20[2] = -((char)((uint)uVar2 >> 0x10) == '\0');
            auVar20[3] = -((char)((uint)uVar2 >> 0x18) == '\0');
            auVar20[4] = 0xff;
            auVar20[5] = 0xff;
            auVar20[6] = 0xff;
            auVar20[7] = 0xff;
            auVar20[8] = 0xff;
            auVar20[9] = 0xff;
            auVar20[10] = 0xff;
            auVar20[0xb] = 0xff;
            auVar20[0xc] = 0xff;
            auVar20[0xd] = 0xff;
            auVar20[0xe] = 0xff;
            auVar20[0xf] = 0xff;
            auVar4._8_4_ = 0xffffffff;
            auVar4._0_8_ = 0xffffffffffffffff;
            auVar4._12_4_ = 0xffffffff;
            auVar20 = auVar20 ^ auVar4;
            auVar28._0_14_ = auVar20._0_14_;
            auVar28[0xe] = auVar20[7];
            auVar28[0xf] = auVar20[7];
            auVar27._14_2_ = auVar28._14_2_;
            auVar27._0_13_ = auVar20._0_13_;
            auVar27[0xd] = auVar20[6];
            auVar26._13_3_ = auVar27._13_3_;
            auVar26._0_12_ = auVar20._0_12_;
            auVar26[0xc] = auVar20[6];
            auVar25._12_4_ = auVar26._12_4_;
            auVar25._0_11_ = auVar20._0_11_;
            auVar25[0xb] = auVar20[5];
            auVar24._11_5_ = auVar25._11_5_;
            auVar24._0_10_ = auVar20._0_10_;
            auVar24[10] = auVar20[5];
            auVar23._10_6_ = auVar24._10_6_;
            auVar23._0_9_ = auVar20._0_9_;
            auVar23[9] = auVar20[4];
            auVar22._9_7_ = auVar23._9_7_;
            auVar22._0_8_ = auVar20._0_8_;
            auVar22[8] = auVar20[4];
            Var7 = CONCAT91(CONCAT81(auVar22._8_8_,auVar20[3]),auVar20[3]);
            auVar6._2_10_ = Var7;
            auVar6[1] = auVar20[2];
            auVar6[0] = auVar20[2];
            auVar5._2_12_ = auVar6;
            auVar5[1] = auVar20[1];
            auVar5[0] = auVar20[1];
            auVar21._0_2_ = CONCAT11(auVar20[0],auVar20[0]);
            auVar21._2_14_ = auVar5;
            uVar33 = (undefined2)Var7;
            auVar31._0_12_ = auVar21._0_12_;
            auVar31._12_2_ = uVar33;
            auVar31._14_2_ = uVar33;
            auVar30._12_4_ = auVar31._12_4_;
            auVar30._0_10_ = auVar21._0_10_;
            auVar30._10_2_ = auVar6._0_2_;
            auVar29._10_6_ = auVar30._10_6_;
            auVar29._0_8_ = auVar21._0_8_;
            auVar29._8_2_ = auVar6._0_2_;
            auVar32._8_8_ = auVar29._8_8_;
            auVar32._6_2_ = auVar5._0_2_;
            auVar32._4_2_ = auVar5._0_2_;
            auVar32._2_2_ = auVar21._0_2_;
            auVar32._0_2_ = auVar21._0_2_;
            auVar32 = auVar32 & _DAT_001bae70;
            iVar9 = iVar9 + auVar32._0_4_;
            iVar16 = iVar16 + auVar32._4_4_;
            iVar18 = iVar18 + auVar32._8_4_;
            iVar19 = iVar19 + auVar32._12_4_;
            lVar12 = lVar12 + 4;
          } while (lVar12 != 0x100);
          uVar17 = iVar19 + iVar16 + iVar18 + iVar9;
          WVar10 = WEBP_FILTER_NONE;
          if (0x10 < uVar17) {
            WVar10 = WebPEstimateBestFilter(dst,dst_stride,height,dst_stride);
          }
          uVar17 = (uint)(0xc0 < uVar17 || 3 < iVar8) | 1 << (WVar10 & 0x1f);
          best.score = 0xffffffff;
          VP8BitWriterInit(&best.bw,0);
          if (uVar17 == 1) goto LAB_0013125e;
LAB_001312b0:
          puVar13 = (uint8_t *)WebPSafeMalloc(1,(long)(int)(height * dst_stride));
          if (puVar13 != (uint8_t *)0x0) {
            iVar16 = 0;
            do {
              iVar9 = 1;
              if ((uVar17 & 1) != 0) {
                iVar9 = EncodeAlphaInternal(dst,dst_stride,height,method,iVar16,
                                            (uint)((int)uVar1 < 100),iVar8,puVar13,
                                            (FilterTrial *)color);
                if ((iVar9 == 0) || (best.score <= (ulong)color._0_8_)) {
                  VP8BitWriterWipeOut((VP8BitWriter *)(color + 8));
                }
                else {
                  VP8BitWriterWipeOut(&best.bw);
                  memcpy(&best,color,0xf8);
                }
              }
              if (uVar17 < 2) break;
              iVar16 = iVar16 + 1;
              uVar17 = uVar17 >> 1;
            } while (iVar9 != 0);
            WebPSafeFree(puVar13);
            goto LAB_00131375;
          }
LAB_001313cc:
          WebPEncodingSetError(pic,VP8_ENC_ERROR_OUT_OF_MEMORY);
          best.bw.buf_ = (uint8_t *)0x0;
          best.bw.pos_ = 0;
          iVar8 = 0;
        }
        else {
          if (cVar15 != '\0') {
            best.score = 0xffffffff;
            VP8BitWriterInit(&best.bw,0);
            uVar17 = 0xf;
            goto LAB_001312b0;
          }
          best.score = 0xffffffff;
          VP8BitWriterInit(&best.bw,0);
LAB_0013125e:
          iVar9 = EncodeAlphaInternal(dst,dst_stride,height,method,0,(uint)((int)uVar1 < 100),iVar8,
                                      (uint8_t *)0x0,&best);
LAB_00131375:
          if (iVar9 == 0) {
            VP8BitWriterWipeOut(&best.bw);
            goto LAB_001313cc;
          }
          if (pWVar3 != (WebPAuxStats *)0x0) {
            pWVar3->cross_color_transform_bits = best.stats.cross_color_transform_bits;
            pWVar3->lossless_features = best.stats.lossless_features;
            pWVar3->histogram_bits = best.stats.histogram_bits;
            pWVar3->transform_bits = best.stats.transform_bits;
            pWVar3->cache_bits = best.stats.cache_bits;
            pWVar3->palette_size = best.stats.palette_size;
            pWVar3->lossless_size = best.stats.lossless_size;
            pWVar3->lossless_hdr_size = best.stats.lossless_hdr_size;
            pWVar3->lossless_data_size = best.stats.lossless_data_size;
          }
          iVar8 = 1;
        }
        pWVar3 = pic->stats;
        uVar11 = best.bw.pos_;
        puVar13 = best.bw.buf_;
        if (pWVar3 != (WebPAuxStats *)0x0) {
          pWVar3->coded_size = pWVar3->coded_size + (int)best.bw.pos_;
          *(uint64_t *)((long)arg1 + 0x5bf0) = local_238;
        }
      }
      WebPSafeFree(dst);
      goto LAB_00131015;
    }
    error = VP8_ENC_ERROR_OUT_OF_MEMORY;
  }
  else {
    error = VP8_ENC_ERROR_INVALID_CONFIGURATION;
  }
  iVar8 = WebPEncodingSetError(pic,error);
  puVar13 = (uint8_t *)0x0;
  uVar11 = 0;
LAB_00131015:
  iVar9 = 0;
  if (iVar8 != 0) {
    if (uVar11 >> 0x20 == 0) {
      *(int *)((long)arg1 + 0x228) = (int)uVar11;
      *(uint8_t **)((long)arg1 + 0x220) = puVar13;
      iVar9 = 1;
    }
    else {
      WebPSafeFree(puVar13);
      iVar9 = 0;
    }
  }
  return iVar9;
}

Assistant:

static int CompressAlphaJob(void* arg1, void* unused) {
  VP8Encoder* const enc = (VP8Encoder*)arg1;
  const WebPConfig* config = enc->config_;
  uint8_t* alpha_data = NULL;
  size_t alpha_size = 0;
  const int effort_level = config->method;  // maps to [0..6]
  const WEBP_FILTER_TYPE filter =
      (config->alpha_filtering == 0) ? WEBP_FILTER_NONE :
      (config->alpha_filtering == 1) ? WEBP_FILTER_FAST :
                                       WEBP_FILTER_BEST;
  if (!EncodeAlpha(enc, config->alpha_quality, config->alpha_compression,
                   filter, effort_level, &alpha_data, &alpha_size)) {
    return 0;
  }
  if (alpha_size != (uint32_t)alpha_size) {  // Soundness check.
    WebPSafeFree(alpha_data);
    return 0;
  }
  enc->alpha_data_size_ = (uint32_t)alpha_size;
  enc->alpha_data_ = alpha_data;
  (void)unused;
  return 1;
}